

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  atomic<long> aVar1;
  atomic<long> aVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *this;
  ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
  *this_00;
  long lVar9;
  long lVar10;
  int *arg;
  char *pcVar11;
  __atomic_base<long> _Var12;
  uint uVar13;
  pointer __p;
  __atomic_base<long> _Var14;
  bool bVar15;
  int local_ac;
  double local_a8;
  uint local_9c;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  seconds oneSecond;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (argc < 5) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar8 = std::operator<<(poVar8,*argv);
    pcVar11 = " <lru|scalable> <threads> <cache-size> <demand-size> [<duration>]\n";
LAB_0010a57c:
    std::operator<<(poVar8,pcVar11);
    iVar3 = 1;
  }
  else {
    pcVar11 = argv[1];
    iVar3 = strcmp(pcVar11,"lru");
    if (iVar3 != 0) {
      iVar4 = strcmp(pcVar11,"scalable");
      if (iVar4 != 0) {
        poVar8 = (ostream *)&std::cerr;
        pcVar11 = "Cache type must be either \"lru\" or \"scalable\"\n";
        goto LAB_0010a57c;
      }
    }
    cacheType = iVar3 != 0;
    uVar5 = boost::lexical_cast<int,char*>(argv + 2);
    uVar6 = boost::lexical_cast<int,char*>(argv + 3);
    uVar7 = boost::lexical_cast<int,char*>(argv + 4);
    local_a8._0_4_ = 0;
    iVar3 = local_a8._0_4_;
    local_a8._0_4_ = 0;
    if (argc != 5) {
      iVar3 = boost::lexical_cast<int,char*>(argv + 5);
    }
    local_a8._0_4_ = iVar3;
    this = (ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
            *)operator_new(0x2b8);
    local_9c = uVar6;
    tstarling::
    ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
    ::ThreadSafeLRUCache(this,(long)(int)uVar6);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    __uniq_ptr_impl<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::reset((__uniq_ptr_impl<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
             *)&aecm,this);
    std::
    unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::~unique_ptr((unique_ptr<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                   *)&threads);
    this_00 = (ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
               *)operator_new(0x28);
    tstarling::
    ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
    ::ThreadSafeScalableCache(this_00,(long)(int)uVar6,0);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::
    __uniq_ptr_impl<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::reset((__uniq_ptr_impl<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
             *)&secm,this_00);
    std::
    unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
    ::~unique_ptr((unique_ptr<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>,_std::default_delete<tstarling::ThreadSafeScalableCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>_>_>
                   *)&threads);
    for (local_ac = 0; local_ac < (int)uVar7; local_ac = local_ac + 1) {
      oneSecond.__r = (rep)local_60;
      std::__cxx11::string::_M_construct((ulong)&oneSecond,'d');
      boost::lexical_cast<std::__cxx11::string,int>(&local_50,(boost *)&local_ac,arg);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&threads,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oneSecond
                     ,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&oneSecond);
      tstarling::ThreadSafeStringKey::ThreadSafeStringKey
                ((ThreadSafeStringKey *)&oneSecond,
                 (char *)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                 (size_t)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      std::vector<tstarling::ThreadSafeStringKey,_std::allocator<tstarling::ThreadSafeStringKey>_>::
      emplace_back<tstarling::ThreadSafeStringKey>(&strings,(ThreadSafeStringKey *)&oneSecond);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      std::__cxx11::string::~string((string *)&threads);
    }
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::reserve(&threads,(long)(int)uVar5);
    lVar9 = std::chrono::_V2::steady_clock::now();
    oneSecond.__r = 1;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = uVar5;
    }
    uVar13 = uVar6;
    while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
      std::thread::thread<void(&)(),,void>((thread *)&local_50,threadMain);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&threads,(thread *)&local_50);
      std::thread::~thread((thread *)&local_50);
    }
    if (local_a8._0_4_ == 0) {
      _Var12._M_i = 0;
      _Var14._M_i = 0;
      do {
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&oneSecond);
        aVar2 = globalTotalCount;
        aVar1 = globalHitCount;
        printf("rate = %.5g kreq/s, hit ratio = %.3g%%\n",
               (double)((long)globalTotalCount.super___atomic_base<long>._M_i - _Var14._M_i) /
               1000.0,((double)((long)globalHitCount.super___atomic_base<long>._M_i - _Var12._M_i) /
                      (double)((long)globalTotalCount.super___atomic_base<long>._M_i - _Var14._M_i))
                      * 100.0);
        _Var12 = aVar1.super___atomic_base<long>._M_i;
        _Var14 = aVar2.super___atomic_base<long>._M_i;
      } while( true );
    }
    local_50._M_dataplus._M_p = (pointer)(long)local_a8._0_4_;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&local_50);
    aVar2 = globalTotalCount;
    aVar1 = globalHitCount;
    lVar10 = std::chrono::_V2::steady_clock::now();
    local_a8 = (double)(lVar10 - lVar9) / 1000000000.0;
    stop = true;
    for (lVar9 = 0; (ulong)uVar6 << 3 != lVar9; lVar9 = lVar9 + 8) {
      std::thread::join();
    }
    puts("type\tthreads\tcache\tdemand\tduration\trate\tratio");
    pcVar11 = "lru";
    if (cacheType != '\0') {
      pcVar11 = "scal";
    }
    printf("%s\t%d\t%d\t%d\t%g\t%g\t%g%%\n",local_a8,
           ((double)(long)aVar2.super___atomic_base<long>._M_i / 1000.0) / local_a8,
           ((double)(long)aVar1.super___atomic_base<long>._M_i /
           (double)(long)aVar2.super___atomic_base<long>._M_i) * 100.0,pcVar11,(ulong)uVar5,
           (ulong)local_9c,(ulong)uVar7);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char ** argv) {
  using std::chrono::steady_clock;
  using std::chrono::seconds;
  using std::chrono::duration_cast;
  using std::chrono::duration;

  if (argc < 5) {
    std::cerr << "Usage: " << argv[0] << " <lru|scalable> <threads> <cache-size> <demand-size> [<duration>]\n";
    return 1;
  }

  if (0 == strcmp(argv[1], "lru")) {
    cacheType = LRU;
  } else if (0 == strcmp(argv[1], "scalable")) {
    cacheType = SCALABLE;
  } else {
    std::cerr << "Cache type must be either \"lru\" or \"scalable\"\n";
    return 1;
  }

  int numThreads = boost::lexical_cast<int>(argv[2]);
  int cacheSize = boost::lexical_cast<int>(argv[3]);
  int demandSize = boost::lexical_cast<int>(argv[4]);
  int durationLimit = 0;

  if (argc > 5) {
    durationLimit = boost::lexical_cast<int>(argv[5]);
  }

  aecm = std::unique_ptr<AtomicCache>(new AtomicCache(cacheSize));
  secm = std::unique_ptr<ScalableCache>(new ScalableCache(cacheSize));
  for (int i = 0; i < demandSize; i++) {
    std::string s = std::string(100, 'x') + boost::lexical_cast<std::string>(i);
    strings.push_back(String(s.data(), s.size()));
  }

  std::vector<std::thread> threads;
  threads.reserve(numThreads);
  auto startTime = steady_clock::now();
  auto oneSecond = seconds(1);

  for (int i = 0; i < numThreads; i++) {
    threads.push_back(std::thread(threadMain));
  }
  if (durationLimit == 0) {
    long prevTotalCount = 0, prevHitCount = 0;
    for (;;) {
      std::this_thread::sleep_for(oneSecond);
      long totalCount = globalTotalCount.load();
      long hitCount = globalHitCount.load();
      printf("rate = %.5g kreq/s, hit ratio = %.3g%%\n",
          (totalCount - prevTotalCount) / 1000.,
          (double)(hitCount - prevHitCount) / (totalCount - prevTotalCount) * 100);

      prevTotalCount = totalCount;
      prevHitCount = hitCount;
    }
  } else {
    std::this_thread::sleep_for(oneSecond * durationLimit);
    long totalCount = globalTotalCount.load();
    long hitCount = globalHitCount.load();
    auto totalTime = duration_cast<duration<double>>(
        steady_clock::now() - startTime);
    stop = true;
    for (int i = 0; i < numThreads; i++) {
      threads[i].join();
    }
    printf("type\tthreads\tcache\tdemand\tduration\trate\tratio\n");
    printf("%s\t%d\t%d\t%d\t%g\t%g\t%g%%\n",
        cacheType == LRU ? "lru" : "scal",
        numThreads,
        cacheSize,
        demandSize,
        totalTime.count(),
        totalCount / 1000. / totalTime.count(),
        (double)hitCount / totalCount * 100);
  }
  return 0;
}